

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

void __thiscall irr::video::CNullDriver::drawMeshBuffer(CNullDriver *this,IMeshBuffer *mb)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  if (mb != (IMeshBuffer *)0x0) {
    iVar1 = (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x6a])();
    if (CONCAT44(extraout_var,iVar1) != 0) {
      (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x6c])(this,CONCAT44(extraout_var,iVar1));
      return;
    }
    iVar1 = (*mb->_vptr_IMeshBuffer[3])(mb);
    uVar2 = (*mb->_vptr_IMeshBuffer[5])(mb);
    iVar3 = (*mb->_vptr_IMeshBuffer[7])(mb);
    uVar4 = (*mb->_vptr_IMeshBuffer[0x1e])(mb);
    uVar5 = (*mb->_vptr_IMeshBuffer[2])(mb);
    uVar6 = (*mb->_vptr_IMeshBuffer[0x1d])(mb);
    iVar7 = (*mb->_vptr_IMeshBuffer[6])(mb);
    (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2b])
              (this,CONCAT44(extraout_var_00,iVar1),(ulong)uVar2,CONCAT44(extraout_var_01,iVar3),
               (ulong)uVar4,(ulong)uVar5,(ulong)uVar6,CONCAT44(extraout_var_02,iVar7));
  }
  return;
}

Assistant:

void CNullDriver::drawMeshBuffer(const scene::IMeshBuffer *mb)
{
	if (!mb)
		return;

	// IVertexBuffer and IIndexBuffer later
	SHWBufferLink *HWBuffer = getBufferLink(mb);

	if (HWBuffer)
		drawHardwareBuffer(HWBuffer);
	else
		drawVertexPrimitiveList(mb->getVertices(), mb->getVertexCount(), mb->getIndices(), mb->getPrimitiveCount(), mb->getVertexType(), mb->getPrimitiveType(), mb->getIndexType());
}